

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::GeneratedCodeInfo::MergePartialFromCodedStream
          (GeneratedCodeInfo *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  void *pvVar4;
  bool bVar5;
  uint32 uVar6;
  Type *this_00;
  pair<int,_int> pVar7;
  int iVar8;
  UnknownFieldSet *unknown_fields;
  int byte_limit;
  uint tag;
  ulong uVar9;
  int iVar10;
  
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003d29b1;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003d29b1:
      uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar9 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar6 | uVar9;
    }
    tag = (uint)uVar9;
    iVar10 = 6;
    iVar8 = iVar10;
    if (((uVar9 & 0x100000000) == 0) || ((char)uVar9 != '\n' || (tag & 0xfffffff8) != 8)) {
      iVar8 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        pvVar4 = (this->_internal_metadata_).
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 .ptr_;
        if (((ulong)pvVar4 & 1) == 0) {
          unknown_fields =
               internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
        }
        else {
          unknown_fields = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
        }
        bVar5 = internal::WireFormat::SkipField(input,tag,unknown_fields);
        goto LAB_003d2a42;
      }
    }
    else {
      this_00 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::TypeHandler>
                          (&(this->annotation_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < (char)*puVar3)) {
        input->buffer_ = puVar3 + 1;
        bVar5 = true;
      }
      else {
        byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar5 = -1 < byte_limit;
      }
      if (((bVar5) &&
          (pVar7 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit),
          -1 < (long)pVar7)) &&
         (bVar5 = GeneratedCodeInfo_Annotation::MergePartialFromCodedStream(this_00,input), bVar5))
      {
        bVar5 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar7.first);
LAB_003d2a42:
        iVar8 = iVar10;
        if (bVar5 != false) {
          iVar8 = 0;
        }
      }
    }
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool GeneratedCodeInfo::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.GeneratedCodeInfo)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.GeneratedCodeInfo.Annotation annotation = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_annotation()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.GeneratedCodeInfo)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.GeneratedCodeInfo)
  return false;
#undef DO_
}